

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.cpp
# Opt level: O2

void __thiscall duckdb::BaseScanner::FinalizeChunkProcess(BaseScanner *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"FinalizeChunkProcess() from CSV Base Scanner is not implemented",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseScanner::FinalizeChunkProcess() {
	throw InternalException("FinalizeChunkProcess() from CSV Base Scanner is not implemented");
}